

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

iterator * __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
InnerMap::InsertUniqueInTree(iterator *__return_storage_ptr__,InnerMap *this,size_type b,Node *node)

{
  LogMessage *other;
  void **ppvVar1;
  pair<std::_Rb_tree_iterator<long_*>,_bool> pVar2;
  LogFinisher local_61;
  Node *local_60 [7];
  
  ppvVar1 = this->table_;
  if (ppvVar1[b] != ppvVar1[b ^ 1]) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x2b8);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)local_60,"CHECK failed: (table_[b]) == (table_[b ^ 1]): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_60);
    ppvVar1 = this->table_;
  }
  node->next = (Node *)0x0;
  local_60[0] = node;
  pVar2 = std::
          _Rb_tree<long*,long*,std::_Identity<long*>,google::protobuf::Map<long,std::__cxx11::string>::InnerMap::KeyCompare,google::protobuf::Map<long,std::__cxx11::string>::MapAllocator<long*>>
          ::_M_insert_unique<long*>
                    ((_Rb_tree<long*,long*,std::_Identity<long*>,google::protobuf::Map<long,std::__cxx11::string>::InnerMap::KeyCompare,google::protobuf::Map<long,std::__cxx11::string>::MapAllocator<long*>>
                      *)ppvVar1[b],(long **)local_60);
  iterator_base<google::protobuf::Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::KeyValuePair>
  ::iterator_base(__return_storage_ptr__,(_Base_ptr)pVar2.first._M_node,this,b & 0xfffffffffffffffe)
  ;
  return __return_storage_ptr__;
}

Assistant:

iterator InsertUniqueInTree(size_type b, Node* node) {
      GOOGLE_DCHECK_EQ(table_[b], table_[b ^ 1]);
      // Maintain the invariant that node->next is NULL for all Nodes in Trees.
      node->next = NULL;
      return iterator(static_cast<Tree*>(table_[b])
                      ->insert(KeyPtrFromNodePtr(node))
                      .first,
                      this, b & ~static_cast<size_t>(1));
    }